

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

string * __thiscall
wabt::(anonymous_namespace)::TypesToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TypeVector *types,char *prefix
          )

{
  int iVar1;
  long lVar2;
  string *psVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
  if (types != (TypeVector *)0x0) {
    std::__cxx11::string::append((string *)__return_storage_ptr__,(char *)types);
  }
  lVar2 = *(long *)this;
  if (*(long *)(this + 8) != lVar2) {
    uVar6 = 0;
    do {
      iVar1 = *(int *)(lVar2 + uVar6 * 4);
      if (iVar1 < -0x10) {
        if (iVar1 == -0x40) {
          pcVar5 = "void";
        }
        else if (iVar1 == -0x20) {
          pcVar5 = "func";
        }
        else {
          if (iVar1 != -0x18) goto switchD_00f521ba_caseD_fffffff1;
          pcVar5 = "except_ref";
        }
      }
      else {
        pcVar5 = "i32";
        switch(iVar1) {
        case 0:
          pcVar5 = "any";
          break;
        case -0x10:
          pcVar5 = "anyfunc";
          break;
        default:
switchD_00f521ba_caseD_fffffff1:
          pcVar5 = "<type index>";
          break;
        case -5:
          pcVar5 = "v128";
          break;
        case -4:
          pcVar5 = "f64";
          break;
        case -3:
          pcVar5 = "f32";
          break;
        case -2:
          pcVar5 = "i64";
          break;
        case -1:
          break;
        }
      }
      std::__cxx11::string::append((string *)__return_storage_ptr__,pcVar5);
      lVar2 = *(long *)this;
      uVar4 = *(long *)(this + 8) - lVar2 >> 2;
      if (uVar6 < uVar4 - 1) {
        std::__cxx11::string::append((string *)__return_storage_ptr__,", ");
        lVar2 = *(long *)this;
        uVar4 = *(long *)(this + 8) - lVar2 >> 2;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar4);
  }
  psVar3 = (string *)std::__cxx11::string::append((string *)__return_storage_ptr__,"]");
  return psVar3;
}

Assistant:

std::string TypesToString(const TypeVector& types,
                          const char* prefix = nullptr) {
  std::string result = "[";
  if (prefix) {
    result += prefix;
  }

  for (size_t i = 0; i < types.size(); ++i) {
    result += GetTypeName(types[i]);
    if (i < types.size() - 1) {
      result += ", ";
    }
  }
  result += "]";
  return result;
}